

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O0

bool Js::AsmJSCompiler::CheckFunctionsSequential(AsmJsModuleCompiler *m)

{
  code *pcVar1;
  bool bVar2;
  AsmJSParser *val;
  undefined4 *puVar3;
  ParseNodeFnc *fncNode;
  ParseNode *pPVar4;
  ParseNode *local_28;
  ParseNode *pnode;
  AsmJSParser *list;
  AsmJsModuleCompiler *m_local;
  
  val = AsmJsModuleCompiler::GetCurrentParserNode(m);
  if ((*val)->nop != knopList) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2c3,"(list->nop == knopList)","list->nop == knopList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = ParserWrapper::GetBinaryLeft(*val);
  while (local_28->nop == knopFncDecl) {
    fncNode = ParseNode::AsParseNodeFnc(local_28);
    bVar2 = CheckFunction(m,fncNode);
    if (!bVar2) {
      return false;
    }
    pPVar4 = ParserWrapper::GetBinaryRight(*val);
    if (pPVar4->nop == knopEndCode) break;
    pPVar4 = ParserWrapper::GetBinaryRight(*val);
    *val = pPVar4;
    local_28 = ParserWrapper::GetBinaryLeft(*val);
  }
  AsmJsModuleCompiler::SetCurrentParseNode(m,val);
  return true;
}

Assistant:

bool AsmJSCompiler::CheckFunctionsSequential( AsmJsModuleCompiler &m )
    {
        AsmJSParser& list = m.GetCurrentParserNode();
        Assert( list->nop == knopList );


        ParseNode* pnode = ParserWrapper::GetBinaryLeft(list);

        while (pnode->nop == knopFncDecl)
        {
            if( !CheckFunction( m, pnode->AsParseNodeFnc() ) )
            {
                return false;
            }

            if(ParserWrapper::GetBinaryRight(list)->nop == knopEndCode)
            {
                break;
            }
            list = ParserWrapper::GetBinaryRight(list);
            pnode = ParserWrapper::GetBinaryLeft(list);
        }

        m.SetCurrentParseNode( list );

        return true;
    }